

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

int Abc_TtHieRetrieveOrInsert(Abc_TtHieMan_t *p,int level,word *pTruth,word *pResult)

{
  int iVar1;
  int *piVar2;
  word *pIn2;
  word *pRepTruth;
  int local_38;
  int truthId;
  int iSpot;
  int i;
  word *pResult_local;
  word *pTruth_local;
  int level_local;
  Abc_TtHieMan_t *p_local;
  
  if (p == (Abc_TtHieMan_t *)0x0) {
    p_local._4_4_ = -1;
  }
  else {
    pTruth_local._4_4_ = level;
    if (level < 0) {
      pTruth_local._4_4_ = p->nLastLevel + 1 + level;
    }
    if ((pTruth_local._4_4_ < 0) || (p->nLastLevel < pTruth_local._4_4_)) {
      p_local._4_4_ = -1;
    }
    else {
      piVar2 = Vec_MemHashLookup(p->vTtMem[pTruth_local._4_4_],pTruth);
      local_38 = *piVar2;
      if (local_38 == -1) {
        iVar1 = Vec_MemHashInsert(p->vTtMem[pTruth_local._4_4_],pTruth);
        p->vTruthId[pTruth_local._4_4_] = iVar1;
        if (pTruth_local._4_4_ < p->nLastLevel) {
          return 0;
        }
        local_38 = p->vTruthId[pTruth_local._4_4_];
      }
      if (pTruth_local._4_4_ < p->nLastLevel) {
        pRepTruth._4_4_ = Vec_IntEntry(p->vRepres[pTruth_local._4_4_],local_38);
      }
      else {
        pRepTruth._4_4_ = local_38;
      }
      for (truthId = 0; truthId < pTruth_local._4_4_; truthId = truthId + 1) {
        Vec_IntSetEntry(p->vRepres[truthId],p->vTruthId[truthId],pRepTruth._4_4_);
      }
      pIn2 = Vec_MemReadEntry(p->vTtMem[p->nLastLevel],pRepTruth._4_4_);
      if (pTruth_local._4_4_ < p->nLastLevel) {
        Abc_TtCopy(pResult,pIn2,p->nWords,0);
        p_local._4_4_ = 1;
      }
      else {
        iVar1 = Abc_TtEqual(pTruth,pIn2,p->nWords);
        if (iVar1 == 0) {
          __assert_fail("Abc_TtEqual(pTruth, pRepTruth, p->nWords)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                        ,0x51b,
                        "int Abc_TtHieRetrieveOrInsert(Abc_TtHieMan_t *, int, word *, word *)");
        }
        if (pTruth != pResult) {
          Abc_TtCopy(pResult,pIn2,p->nWords,0);
        }
        p_local._4_4_ = 0;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int Abc_TtHieRetrieveOrInsert(Abc_TtHieMan_t * p, int level, word * pTruth, word * pResult)
{
    int i, iSpot, truthId;
    word * pRepTruth;
    if (!p) return -1;
    if (level < 0) level += p->nLastLevel + 1;
    if (level < 0 || level > p->nLastLevel) return -1;
    iSpot = *Vec_MemHashLookup(p->vTtMem[level], pTruth);
    if (iSpot == -1) {
        p->vTruthId[level] = Vec_MemHashInsert(p->vTtMem[level], pTruth);
        if (level < p->nLastLevel) return 0;
        iSpot = p->vTruthId[level];
    }
    // return the class representative
    if (level < p->nLastLevel)
        truthId = Vec_IntEntry(p->vRepres[level], iSpot);
    else
        truthId = iSpot;
    for (i = 0; i < level; i++)
        Vec_IntSetEntry(p->vRepres[i], p->vTruthId[i], truthId);

    pRepTruth = Vec_MemReadEntry(p->vTtMem[p->nLastLevel], truthId);
    if (level < p->nLastLevel) {
        Abc_TtCopy(pResult, pRepTruth, p->nWords, 0);
        return 1;
    }
    assert(Abc_TtEqual(pTruth, pRepTruth, p->nWords));
    if (pTruth != pResult)
        Abc_TtCopy(pResult, pRepTruth, p->nWords, 0);
    return 0;
}